

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTarget.cpp
# Opt level: O2

void __thiscall sf::RenderTarget::applyCurrentView(RenderTarget *this)

{
  int extraout_var;
  Transform *this_00;
  float *pfVar1;
  IntRect IVar2;
  
  IVar2 = getViewport(this,&this->m_view);
  (*this->_vptr_RenderTarget[2])(this);
  glViewport(IVar2._0_8_ & 0xffffffff,extraout_var - (IVar2.top + IVar2.height),
             IVar2._8_8_ & 0xffffffff);
  priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/sfml-src/src/SFML/Graphics/RenderTarget.cpp"
                     ,0x233,"glViewport(viewport.left, top, viewport.width, viewport.height)");
  glMatrixMode(0x1701);
  priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/sfml-src/src/SFML/Graphics/RenderTarget.cpp"
                     ,0x236,"glMatrixMode(GL_PROJECTION)");
  this_00 = View::getTransform(&this->m_view);
  pfVar1 = Transform::getMatrix(this_00);
  glLoadMatrixf(pfVar1);
  priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/sfml-src/src/SFML/Graphics/RenderTarget.cpp"
                     ,0x237,"glLoadMatrixf(m_view.getTransform().getMatrix())");
  glMatrixMode(0x1700);
  priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/sfml-src/src/SFML/Graphics/RenderTarget.cpp"
                     ,0x23a,"glMatrixMode(GL_MODELVIEW)");
  (this->m_cache).viewChanged = false;
  return;
}

Assistant:

void RenderTarget::applyCurrentView()
{
    // Set the viewport
    IntRect viewport = getViewport(m_view);
    int top = getSize().y - (viewport.top + viewport.height);
    glCheck(glViewport(viewport.left, top, viewport.width, viewport.height));

    // Set the projection matrix
    glCheck(glMatrixMode(GL_PROJECTION));
    glCheck(glLoadMatrixf(m_view.getTransform().getMatrix()));

    // Go back to model-view mode
    glCheck(glMatrixMode(GL_MODELVIEW));

    m_cache.viewChanged = false;
}